

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen-x86_64.c
# Opt level: O0

void target_machinize(gen_ctx_t gen_ctx)

{
  MIR_op_t dst_op;
  MIR_op_t dst_op_00;
  MIR_op_t dst_op_01;
  MIR_op_t dst_op_02;
  MIR_op_t src_op;
  MIR_op_t src_op_00;
  MIR_op_t src_op_01;
  MIR_op_t src_op_02;
  undefined1 t [4];
  undefined8 uVar1;
  undefined4 base;
  MIR_insn_code_t MVar2;
  MIR_func_t pMVar3;
  MIR_context_t pMVar4;
  int iVar5;
  MIR_reg_t MVar6;
  uint uVar7;
  uint32_t uVar8;
  MIR_insn_t_conflict pMVar9;
  size_t sVar10;
  MIR_error_func_t p_Var11;
  ushort uVar12;
  bool bVar13;
  MIR_insn_code_t local_e94;
  MIR_insn_code_t local_e90;
  MIR_type_t local_e8c;
  ulong local_e20;
  undefined1 auStack_e18 [8];
  MIR_op_t dreg_op;
  MIR_op_t areg_op_2;
  MIR_op_t areg_op_1;
  MIR_op_t areg_op;
  MIR_op_t creg_op;
  ulong local_cf0;
  size_t nres;
  uint local_ce0;
  uint32_t n_fregs;
  uint32_t n_xregs;
  uint32_t n_iregs;
  MIR_op_t local_ca8;
  MIR_op_t local_c78;
  MIR_op_t local_c48;
  MIR_op_t local_c18;
  undefined1 local_be8 [8];
  MIR_op_t op3;
  MIR_op_t va_reg_op;
  MIR_op_t res_reg_op_1;
  MIR_op_t reg_op3;
  MIR_op_t func_reg_op;
  MIR_op_t ops_1 [6];
  MIR_item_t func_import_item_1;
  MIR_item_t proto_item_1;
  undefined8 uStack_9c0;
  anon_union_32_12_57d33f68_for_u aStack_9b8;
  MIR_op_t local_998;
  MIR_op_t local_968;
  MIR_op_t local_938;
  MIR_op_t local_908;
  MIR_op_t local_8d8;
  MIR_op_t local_8a8;
  MIR_op_t local_878;
  MIR_op_t local_848;
  MIR_op_t local_818;
  MIR_var_t local_7e0;
  uint local_7c4;
  undefined1 auStack_7c0 [4];
  uint32_t narg;
  MIR_var_t var;
  int mem_offset;
  int fp_offset;
  int gp_offset;
  MIR_reg_t va_reg;
  MIR_op_t va_op;
  MIR_op_t treg_op;
  MIR_op_t local_708;
  MIR_op_t local_6d8;
  undefined1 local_6a8 [8];
  MIR_op_t ops [4];
  MIR_op_t op_reg_op;
  MIR_op_t res_reg_op;
  MIR_op_t freg_op;
  MIR_item_t func_import_item;
  MIR_item_t proto_item;
  MIR_op_t local_518;
  MIR_op_t local_4e8;
  MIR_op_t local_4b8;
  MIR_op_t local_488;
  MIR_op_t local_458;
  MIR_op_t local_428;
  int local_3ec;
  undefined1 auStack_3e8 [4];
  int blk_p;
  MIR_op_t local_3b8;
  MIR_op_t local_388;
  MIR_op_t local_358;
  MIR_op_t local_328;
  MIR_op_t local_2f8;
  MIR_reg_t local_2c0;
  MIR_reg_t local_2bc;
  MIR_reg_t reg2_1;
  MIR_reg_t reg1_1;
  MIR_insn_code_t mov_code2_1;
  MIR_insn_code_t mov_code1_1;
  MIR_type_t mov_type2;
  MIR_type_t mov_type1;
  MIR_op_t local_278;
  MIR_op_t local_248;
  MIR_op_t local_218;
  MIR_op_t local_1e8;
  MIR_op_t local_1b8;
  MIR_reg_t local_184;
  MIR_reg_t local_180;
  MIR_reg_t reg1;
  MIR_reg_t reg2;
  MIR_insn_code_t mov_code2;
  MIR_insn_code_t mov_code1;
  MIR_type_t mov_type;
  size_t local_160;
  MIR_var_t local_158;
  long local_140;
  size_t mem_size;
  size_t fp_arg_num;
  size_t int_arg_num;
  size_t blk_size;
  size_t i;
  MIR_op_t temp_op;
  MIR_op_t mem_op;
  MIR_op_t arg_reg_op;
  MIR_op_t ret_reg_op;
  MIR_reg_t arg_reg;
  MIR_reg_t ret_reg;
  MIR_insn_t new_insn;
  MIR_insn_t next_insn;
  MIR_insn_t insn;
  MIR_insn_code_t local_30;
  MIR_insn_code_t new_insn_code;
  MIR_insn_code_t code;
  MIR_type_t res_type;
  MIR_type_t mem_type;
  MIR_type_t type;
  MIR_func_t func;
  MIR_context_t ctx;
  gen_ctx_t gen_ctx_local;
  
  func = (MIR_func_t)gen_ctx->ctx;
  fp_arg_num = 0;
  mem_size = 0;
  local_140 = 0;
  ctx = (MIR_context_t)gen_ctx;
  if (gen_ctx->curr_func_item->item_type != MIR_func_item) {
    __assert_fail("curr_func_item->item_type == MIR_func_item",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                  ,0x2ba,"void target_machinize(gen_ctx_t)");
  }
  _mem_type = (gen_ctx->curr_func_item->u).func;
  gen_ctx->target_ctx->block_arg_func_p = '\0';
  gen_ctx->target_ctx->start_sp_from_bp_offset = 8;
  gen_ctx->target_ctx->keep_fp_p = _mem_type->vararg_p;
  for (blk_size = 0; blk_size < _mem_type->nargs; blk_size = blk_size + 1) {
    VARR_MIR_var_tget(&local_158,_mem_type->vars,blk_size);
    res_type = local_158.type;
    iVar5 = MIR_blk_type_p(local_158.type);
    if (iVar5 == 0) {
      local_e20 = 0;
    }
    else {
      VARR_MIR_var_tget((MIR_var_t *)&mov_code1,_mem_type->vars,blk_size);
      local_e20 = local_160 + 7 & 0xfffffffffffffff8;
    }
    int_arg_num = local_e20;
    if ((((res_type == (MIR_T_BLK|MIR_T_U8)) &&
         (MVar6 = get_int_arg_reg(fp_arg_num), MVar6 != 0xffffffff)) &&
        ((int_arg_num < 9 || (MVar6 = get_int_arg_reg(fp_arg_num + 1), MVar6 != 0xffffffff)))) ||
       (((res_type == (MIR_T_BLK|MIR_T_I16) &&
         (MVar6 = get_fp_arg_reg(mem_size), MVar6 != 0xffffffff)) &&
        ((int_arg_num < 9 || (MVar6 = get_fp_arg_reg(mem_size + 1), MVar6 != 0xffffffff)))))) {
      mov_code2 = MIR_T_D;
      if (res_type == (MIR_T_BLK|MIR_T_U8)) {
        mov_code2 = MIR_T_I64;
      }
      local_184 = get_arg_reg(mov_code2,&fp_arg_num,&mem_size,&reg2);
      if (0x10 < int_arg_num) {
        __assert_fail("blk_size <= 16",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                      ,0x2ce,"void target_machinize(gen_ctx_t)");
      }
      if (8 < int_arg_num) {
        local_180 = get_arg_reg(mov_code2,&fp_arg_num,&mem_size,&reg1);
        pMVar3 = func;
        MVar6 = reg2;
        _MIR_new_var_mem_op(&local_1b8,(MIR_context_t)func,mov_code2,8,(int)blk_size + 0x22,
                            0xffffffff,'\x01');
        _MIR_new_var_op(&local_1e8,(MIR_context_t)func,local_180);
        pMVar9 = MIR_new_insn((MIR_context_t)pMVar3,MVar6);
        prepend_insn((gen_ctx_t)ctx,pMVar9);
      }
      pMVar3 = func;
      MVar6 = reg2;
      _MIR_new_var_mem_op(&local_218,(MIR_context_t)func,mov_code2,0,(int)blk_size + 0x22,0xffffffff
                          ,'\x01');
      _MIR_new_var_op(&local_248,(MIR_context_t)func,local_184);
      pMVar9 = MIR_new_insn((MIR_context_t)pMVar3,MVar6);
      prepend_insn((gen_ctx_t)ctx,pMVar9);
      pMVar3 = func;
      _MIR_new_var_op(&local_278,(MIR_context_t)func,(int)blk_size + 0x22);
      MIR_new_int_op((MIR_op_t *)&mov_type2,(MIR_context_t)func,int_arg_num);
      pMVar9 = MIR_new_insn((MIR_context_t)pMVar3,MIR_ALLOCA);
      prepend_insn((gen_ctx_t)ctx,pMVar9);
    }
    else if ((((res_type == (MIR_T_BLK|MIR_T_U16)) || (res_type == 0x10)) &&
             (MVar6 = get_int_arg_reg(fp_arg_num), MVar6 != 0xffffffff)) &&
            (MVar6 = get_fp_arg_reg(mem_size), MVar6 != 0xffffffff)) {
      mov_code1_1 = MIR_T_D;
      if (res_type == (MIR_T_BLK|MIR_T_U16)) {
        mov_code1_1 = MIR_T_I64;
      }
      mov_code2_1 = MIR_EXT32;
      if (res_type == (MIR_T_BLK|MIR_T_U16)) {
        mov_code2_1 = MIR_UEXT32;
      }
      local_2bc = get_arg_reg(mov_code1_1,&fp_arg_num,&mem_size,&reg1_1);
      local_2c0 = get_arg_reg(mov_code2_1,&fp_arg_num,&mem_size,&reg2_1);
      pMVar3 = func;
      MVar6 = reg2_1;
      if ((int_arg_num < 9) || (0x10 < int_arg_num)) {
        __assert_fail("blk_size > 8 && blk_size <= 16",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                      ,0x2ea,"void target_machinize(gen_ctx_t)");
      }
      _MIR_new_var_mem_op(&local_2f8,(MIR_context_t)func,mov_code2_1,8,(int)blk_size + 0x22,
                          0xffffffff,'\x01');
      _MIR_new_var_op(&local_328,(MIR_context_t)func,local_2c0);
      pMVar9 = MIR_new_insn((MIR_context_t)pMVar3,MVar6);
      prepend_insn((gen_ctx_t)ctx,pMVar9);
      pMVar3 = func;
      MVar6 = reg1_1;
      _MIR_new_var_mem_op(&local_358,(MIR_context_t)func,mov_code1_1,0,(int)blk_size + 0x22,
                          0xffffffff,'\x01');
      _MIR_new_var_op(&local_388,(MIR_context_t)func,local_2bc);
      pMVar9 = MIR_new_insn((MIR_context_t)pMVar3,MVar6);
      prepend_insn((gen_ctx_t)ctx,pMVar9);
      pMVar3 = func;
      _MIR_new_var_op(&local_3b8,(MIR_context_t)func,(int)blk_size + 0x22);
      MIR_new_int_op((MIR_op_t *)auStack_3e8,(MIR_context_t)func,int_arg_num);
      pMVar9 = MIR_new_insn((MIR_context_t)pMVar3,MIR_ALLOCA);
      prepend_insn((gen_ctx_t)ctx,pMVar9);
    }
    else {
      local_3ec = MIR_blk_type_p(res_type);
      pMVar3 = func;
      if (local_3ec == 0) {
        MVar6 = get_arg_reg(res_type,&fp_arg_num,&mem_size,(MIR_insn_code_t *)((long)&insn + 4));
        if (MVar6 == 0xffffffff) {
          *(undefined1 *)((long)&(ctx[1].insn_nops)->els_num + 1) = 1;
          *(undefined1 *)((long)&(ctx[1].insn_nops)->els_num + 3) = 1;
          if (((res_type == MIR_T_F) || (res_type == MIR_T_D)) || (res_type == MIR_T_LD)) {
            local_e8c = res_type;
          }
          else {
            local_e8c = MIR_T_I64;
          }
          code = local_e8c;
          if (res_type == MIR_T_F) {
            local_e90 = MIR_FMOV;
          }
          else {
            if (res_type == MIR_T_D) {
              local_e94 = MIR_DMOV;
            }
            else {
              local_e94 = MIR_MOV;
              if (res_type == MIR_T_LD) {
                local_e94 = MIR_LDMOV;
              }
            }
            local_e90 = local_e94;
          }
          insn._4_4_ = local_e90;
          _MIR_new_var_mem_op(&local_518,(MIR_context_t)func,local_e8c,
                              local_140 + 8 + (long)*(int *)((long)&(ctx[1].insn_nops)->els_num + 4)
                              ,5,0xffffffff,'\x01');
          memcpy((void *)((long)&temp_op.u + 0x18),&local_518,0x30);
          pMVar3 = func;
          MVar2 = insn._4_4_;
          _MIR_new_var_op((MIR_op_t *)&proto_item,(MIR_context_t)func,(int)blk_size + 0x22);
          pMVar9 = MIR_new_insn((MIR_context_t)pMVar3,MVar2);
          prepend_insn((gen_ctx_t)ctx,pMVar9);
          iVar5 = 8;
          if (res_type == MIR_T_LD) {
            iVar5 = 0x10;
          }
          local_140 = iVar5 + local_140;
        }
        else {
          _MIR_new_var_op(&local_4b8,(MIR_context_t)func,MVar6);
          memcpy((void *)((long)&mem_op.u + 0x18),&local_4b8,0x30);
          pMVar3 = func;
          MVar2 = insn._4_4_;
          _MIR_new_var_op(&local_4e8,(MIR_context_t)func,(int)blk_size + 0x22);
          pMVar9 = MIR_new_insn((MIR_context_t)pMVar3,MVar2);
          prepend_insn((gen_ctx_t)ctx,pMVar9);
        }
      }
      else {
        *(undefined1 *)((long)&(ctx[1].insn_nops)->els_num + 1) = 1;
        *(undefined1 *)((long)&(ctx[1].insn_nops)->els_num + 3) = 1;
        _MIR_new_var_op(&local_428,(MIR_context_t)func,(int)blk_size + 0x22);
        _MIR_new_var_op(&local_458,(MIR_context_t)func,5);
        MIR_new_int_op(&local_488,(MIR_context_t)func,
                       local_140 + 8 + (long)*(int *)((long)&(ctx[1].insn_nops)->els_num + 4));
        pMVar9 = MIR_new_insn((MIR_context_t)pMVar3,MIR_ADD);
        local_140 = int_arg_num + local_140;
        prepend_insn((gen_ctx_t)ctx,pMVar9);
      }
    }
  }
  *(undefined1 *)&(ctx[1].insn_nops)->els_num = 0;
  *(undefined1 *)((long)&(ctx[1].insn_nops)->els_num + 2) = 1;
  next_insn = DLIST_MIR_insn_t_head(&_mem_type->insns);
  do {
    if (next_insn == (MIR_insn_t)0x0) {
      return;
    }
    new_insn = DLIST_MIR_insn_t_next(next_insn);
    pMVar3 = func;
    local_30 = *(MIR_insn_code_t *)&next_insn->field_0x18;
    switch(local_30) {
    case MIR_UI2F:
    case MIR_UI2D:
    case MIR_UI2LD:
    case MIR_LD2I:
      memcpy((void *)((long)&op_reg_op.u + 0x18),next_insn->ops,0x30);
      memcpy((void *)((long)&ops[3].u + 0x18),next_insn + 1,0x30);
      get_builtin((gen_ctx_t)ctx,local_30,&func_import_item,
                  (MIR_item_t_conflict *)&freg_op.u.mem.disp);
      pMVar3 = func;
      if ((((ushort)res_reg_op.data & 0xff) != 2) || (((ushort)op_reg_op.data & 0xff) != 2)) {
        __assert_fail("res_reg_op.mode == MIR_OP_VAR && op_reg_op.mode == MIR_OP_VAR",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                      ,0x349,"void target_machinize(gen_ctx_t)");
      }
      MVar6 = gen_new_temp_reg((gen_ctx_t)ctx,MIR_T_I64,*(MIR_func_t *)(ctx->error_func + 0x40));
      _MIR_new_var_op(&local_6d8,(MIR_context_t)pMVar3,MVar6);
      memcpy((void *)((long)&res_reg_op.u + 0x18),&local_6d8,0x30);
      pMVar3 = func;
      MIR_new_ref_op(&local_708,(MIR_context_t)func,(MIR_item_t_conflict)freg_op.u.mem.disp);
      new_insn = MIR_new_insn((MIR_context_t)pMVar3,MIR_MOV);
      gen_add_insn_before((gen_ctx_t)ctx,next_insn,new_insn);
      MIR_new_ref_op((MIR_op_t *)((long)&treg_op.u + 0x18),(MIR_context_t)func,func_import_item);
      memcpy(local_6a8,(void *)((long)&treg_op.u + 0x18),0x30);
      memcpy((void *)((long)&ops[0].u + 0x18),(void *)((long)&res_reg_op.u + 0x18),0x30);
      memcpy((void *)((long)&ops[1].u + 0x18),(void *)((long)&op_reg_op.u + 0x18),0x30);
      memcpy((void *)((long)&ops[2].u + 0x18),(void *)((long)&ops[3].u + 0x18),0x30);
      pMVar9 = MIR_new_insn_arr((MIR_context_t)func,MIR_CALL,4,(MIR_op_t *)local_6a8);
      gen_add_insn_before((gen_ctx_t)ctx,next_insn,pMVar9);
      gen_delete_insn((gen_ctx_t)ctx,next_insn);
      break;
    default:
      iVar5 = MIR_call_code_p(local_30);
      if (iVar5 != 0) {
        machinize_call((gen_ctx_t)ctx,next_insn);
        *(undefined1 *)((long)&(ctx[1].insn_nops)->els_num + 2) = 0;
      }
      break;
    case MIR_DIV:
    case MIR_DIVS:
    case MIR_UDIV:
    case MIR_UDIVS:
      _MIR_new_var_op((MIR_op_t *)((long)&areg_op_2.u + 0x18),(MIR_context_t)func,0);
      pMVar9 = MIR_new_insn((MIR_context_t)func,MIR_MOV);
      gen_add_insn_before((gen_ctx_t)ctx,next_insn,pMVar9);
      pMVar9 = MIR_new_insn((MIR_context_t)func,MIR_MOV);
      gen_add_insn_after((gen_ctx_t)ctx,next_insn,pMVar9);
      memcpy(next_insn + 1,(void *)((long)&areg_op_2.u + 0x18),0x30);
      memcpy(next_insn->ops,next_insn + 1,0x30);
      break;
    case MIR_MOD:
    case MIR_MODS:
    case MIR_UMOD:
    case MIR_UMODS:
      _MIR_new_var_op((MIR_op_t *)((long)&dreg_op.u + 0x18),(MIR_context_t)func,0);
      _MIR_new_var_op((MIR_op_t *)auStack_e18,(MIR_context_t)func,2);
      pMVar9 = MIR_new_insn((MIR_context_t)func,MIR_MOV);
      gen_add_insn_before((gen_ctx_t)ctx,next_insn,pMVar9);
      memcpy(next_insn + 1,(void *)((long)&dreg_op.u + 0x18),0x30);
      pMVar9 = MIR_new_insn((MIR_context_t)func,MIR_MOV);
      gen_add_insn_after((gen_ctx_t)ctx,next_insn,pMVar9);
      memcpy(next_insn->ops,auStack_e18,0x30);
      break;
    case MIR_LSH:
    case MIR_LSHS:
    case MIR_RSH:
    case MIR_RSHS:
    case MIR_URSH:
    case MIR_URSHS:
      _MIR_new_var_op((MIR_op_t *)((long)&areg_op.u + 0x18),(MIR_context_t)func,1);
      pMVar9 = MIR_new_insn((MIR_context_t)func,MIR_MOV);
      gen_add_insn_before((gen_ctx_t)ctx,next_insn,pMVar9);
      memcpy(&next_insn[1].ops[0].u,(void *)((long)&areg_op.u + 0x18),0x30);
      break;
    case MIR_EQ:
    case MIR_EQS:
    case MIR_FEQ:
    case MIR_DEQ:
    case MIR_NE:
    case MIR_NES:
    case MIR_FNE:
    case MIR_DNE:
    case MIR_LT:
    case MIR_LTS:
    case MIR_ULT:
    case MIR_ULTS:
    case MIR_FLT:
    case MIR_DLT:
    case MIR_LE:
    case MIR_LES:
    case MIR_ULE:
    case MIR_ULES:
    case MIR_FLE:
    case MIR_DLE:
    case MIR_GT:
    case MIR_GTS:
    case MIR_UGT:
    case MIR_UGTS:
    case MIR_FGT:
    case MIR_DGT:
    case MIR_GE:
    case MIR_GES:
    case MIR_UGE:
    case MIR_UGES:
    case MIR_FGE:
    case MIR_DGE:
      pMVar9 = MIR_new_insn((MIR_context_t)func,MIR_UEXT8);
      gen_add_insn_after((gen_ctx_t)ctx,next_insn,pMVar9);
      switch(local_30) {
      case MIR_FLT:
        memcpy(&i,next_insn + 1,0x30);
        memcpy(next_insn + 1,&next_insn[1].ops[0].u,0x30);
        memcpy(&next_insn[1].ops[0].u,&i,0x30);
        *(ulong *)&next_insn->field_0x18 =
             *(ulong *)&next_insn->field_0x18 & 0xffffffff00000000 | 100;
        break;
      case MIR_DLT:
        memcpy(&i,next_insn + 1,0x30);
        memcpy(next_insn + 1,&next_insn[1].ops[0].u,0x30);
        memcpy(&next_insn[1].ops[0].u,&i,0x30);
        *(ulong *)&next_insn->field_0x18 =
             *(ulong *)&next_insn->field_0x18 & 0xffffffff00000000 | 0x65;
        break;
      default:
        break;
      case MIR_FLE:
        memcpy(&i,next_insn + 1,0x30);
        memcpy(next_insn + 1,&next_insn[1].ops[0].u,0x30);
        memcpy(&next_insn[1].ops[0].u,&i,0x30);
        *(ulong *)&next_insn->field_0x18 =
             *(ulong *)&next_insn->field_0x18 & 0xffffffff00000000 | 0x6b;
        break;
      case MIR_DLE:
        memcpy(&i,next_insn + 1,0x30);
        memcpy(next_insn + 1,&next_insn[1].ops[0].u,0x30);
        memcpy(&next_insn[1].ops[0].u,&i,0x30);
        *(ulong *)&next_insn->field_0x18 =
             *(ulong *)&next_insn->field_0x18 & 0xffffffff00000000 | 0x6c;
      }
      break;
    case MIR_LDLT:
      memcpy(&i,next_insn + 1,0x30);
      memcpy(next_insn + 1,&next_insn[1].ops[0].u,0x30);
      memcpy(&next_insn[1].ops[0].u,&i,0x30);
      *(ulong *)&next_insn->field_0x18 =
           *(ulong *)&next_insn->field_0x18 & 0xffffffff00000000 | 0x66;
      break;
    case MIR_LDLE:
      memcpy(&i,next_insn + 1,0x30);
      memcpy(next_insn + 1,&next_insn[1].ops[0].u,0x30);
      memcpy(&next_insn[1].ops[0].u,&i,0x30);
      *(ulong *)&next_insn->field_0x18 =
           *(ulong *)&next_insn->field_0x18 & 0xffffffff00000000 | 0x6d;
      break;
    case MIR_UMULO:
    case MIR_UMULOS:
      _MIR_new_var_op((MIR_op_t *)((long)&areg_op_1.u + 0x18),(MIR_context_t)func,0);
      pMVar9 = MIR_new_insn((MIR_context_t)func,MIR_MOV);
      gen_add_insn_before((gen_ctx_t)ctx,next_insn,pMVar9);
      pMVar9 = MIR_new_insn((MIR_context_t)func,MIR_MOV);
      gen_add_insn_after((gen_ctx_t)ctx,next_insn,pMVar9);
      memcpy(next_insn + 1,(void *)((long)&areg_op_1.u + 0x18),0x30);
      memcpy(next_insn->ops,next_insn + 1,0x30);
      break;
    case MIR_FBLT:
      memcpy(&i,next_insn + 1,0x30);
      memcpy(next_insn + 1,&next_insn[1].ops[0].u,0x30);
      memcpy(&next_insn[1].ops[0].u,&i,0x30);
      *(ulong *)&next_insn->field_0x18 =
           *(ulong *)&next_insn->field_0x18 & 0xffffffff00000000 | 0x97;
      break;
    case MIR_DBLT:
      memcpy(&i,next_insn + 1,0x30);
      memcpy(next_insn + 1,&next_insn[1].ops[0].u,0x30);
      memcpy(&next_insn[1].ops[0].u,&i,0x30);
      *(ulong *)&next_insn->field_0x18 =
           *(ulong *)&next_insn->field_0x18 & 0xffffffff00000000 | 0x98;
      break;
    case MIR_LDBLT:
      memcpy(&i,next_insn + 1,0x30);
      memcpy(next_insn + 1,&next_insn[1].ops[0].u,0x30);
      memcpy(&next_insn[1].ops[0].u,&i,0x30);
      *(ulong *)&next_insn->field_0x18 =
           *(ulong *)&next_insn->field_0x18 & 0xffffffff00000000 | 0x99;
      break;
    case MIR_FBLE:
      memcpy(&i,next_insn + 1,0x30);
      memcpy(next_insn + 1,&next_insn[1].ops[0].u,0x30);
      memcpy(&next_insn[1].ops[0].u,&i,0x30);
      *(ulong *)&next_insn->field_0x18 =
           *(ulong *)&next_insn->field_0x18 & 0xffffffff00000000 | 0x9e;
      break;
    case MIR_DBLE:
      memcpy(&i,next_insn + 1,0x30);
      memcpy(next_insn + 1,&next_insn[1].ops[0].u,0x30);
      memcpy(&next_insn[1].ops[0].u,&i,0x30);
      *(ulong *)&next_insn->field_0x18 =
           *(ulong *)&next_insn->field_0x18 & 0xffffffff00000000 | 0x9f;
      break;
    case MIR_LDBLE:
      memcpy(&i,next_insn + 1,0x30);
      memcpy(next_insn + 1,&next_insn[1].ops[0].u,0x30);
      memcpy(&next_insn[1].ops[0].u,&i,0x30);
      *(ulong *)&next_insn->field_0x18 =
           *(ulong *)&next_insn->field_0x18 & 0xffffffff00000000 | 0xa0;
      break;
    case MIR_RET:
      n_fregs = 0;
      local_ce0 = 0;
      nres._4_4_ = 0;
      uVar7 = *(uint *)(*(long *)(ctx->error_func + 0x40) + 0x38);
      sVar10 = MIR_insn_nops((MIR_context_t)func,next_insn);
      if (uVar7 != sVar10) {
        __assert_fail("curr_func_item->u.func->nres == MIR_insn_nops (ctx, insn)",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                      ,0x3c2,"void target_machinize(gen_ctx_t)");
      }
      for (local_cf0 = 0; local_cf0 < *(uint *)(*(long *)(ctx->error_func + 0x40) + 0x38);
          local_cf0 = local_cf0 + 1) {
        new_insn_code =
             *(MIR_insn_code_t *)
              (*(long *)(*(long *)(ctx->error_func + 0x40) + 0x48) + local_cf0 * 4);
        if (((new_insn_code == MIR_UEXT16) || (new_insn_code == MIR_UEXT32)) && (local_ce0 < 2)) {
          insn._4_4_ = MIR_DMOV;
          if (new_insn_code == MIR_UEXT16) {
            insn._4_4_ = MIR_FMOV;
          }
          uVar7 = local_ce0 + 1;
          bVar13 = local_ce0 == 0;
          ret_reg_op.u.mem.disp._4_4_ = 0x11;
          local_ce0 = uVar7;
          if (bVar13) {
            ret_reg_op.u.mem.disp._4_4_ = 0x10;
          }
        }
        else if ((new_insn_code == MIR_I2F) && (nres._4_4_ < 2)) {
          insn._4_4_ = MIR_LDMOV;
          ret_reg_op.u.mem.disp._4_4_ = 0x21;
          if (nres._4_4_ == 0) {
            ret_reg_op.u.mem.disp._4_4_ = 0x20;
          }
          nres._4_4_ = nres._4_4_ + 1;
        }
        else if (n_fregs < 2) {
          insn._4_4_ = MIR_MOV;
          uVar8 = n_fregs + 1;
          bVar13 = n_fregs == 0;
          ret_reg_op.u.mem.disp._4_4_ = 2;
          n_fregs = uVar8;
          if (bVar13) {
            ret_reg_op.u.mem.disp._4_4_ = 0;
          }
        }
        else {
          p_Var11 = MIR_get_error_func((MIR_context_t)func);
          (*p_Var11)(MIR_ret_error,"x86-64 can not handle this combination of return values");
        }
        _MIR_new_var_op((MIR_op_t *)((long)&creg_op.u + 0x18),(MIR_context_t)func,
                        ret_reg_op.u.mem.disp._4_4_);
        memcpy((void *)((long)&arg_reg_op.u + 0x18),(void *)((long)&creg_op.u + 0x18),0x30);
        pMVar9 = MIR_new_insn((MIR_context_t)func,insn._4_4_);
        gen_add_insn_before((gen_ctx_t)ctx,next_insn,pMVar9);
        memcpy(next_insn->ops + local_cf0,(void *)((long)&arg_reg_op.u + 0x18),0x30);
      }
      break;
    case MIR_ALLOCA:
      *(undefined1 *)&(ctx[1].insn_nops)->els_num = 1;
      *(undefined1 *)((long)&(ctx[1].insn_nops)->els_num + 3) = 1;
      break;
    case MIR_VA_ARG:
    case MIR_VA_BLOCK_ARG:
      memcpy((void *)((long)&va_reg_op.u + 0x18),next_insn->ops,0x30);
      memcpy((void *)((long)&op3.u + 0x18),next_insn + 1,0x30);
      memcpy(local_be8,&next_insn[1].ops[0].u,0x30);
      get_builtin((gen_ctx_t)ctx,local_30,&func_import_item_1,
                  (MIR_item_t_conflict *)&ops_1[5].u.mem.disp);
      pMVar3 = func;
      if ((((ushort)res_reg_op_1.data & 0xff) != 2) || (((ushort)va_reg_op.data & 0xff) != 2)) {
LAB_0013bc80:
        __assert_fail("res_reg_op.mode == MIR_OP_VAR && va_reg_op.mode == MIR_OP_VAR && op3.mode == (code == MIR_VA_ARG ? MIR_OP_VAR_MEM : MIR_OP_VAR)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                      ,0x3a0,"void target_machinize(gen_ctx_t)");
      }
      uVar12 = 2;
      if (local_30 == MIR_VA_ARG) {
        uVar12 = 0xb;
      }
      if (((ushort)op3.data & 0xff) != uVar12) goto LAB_0013bc80;
      MVar6 = gen_new_temp_reg((gen_ctx_t)ctx,MIR_T_I64,_mem_type);
      _MIR_new_var_op(&local_c18,(MIR_context_t)pMVar3,MVar6);
      memcpy((void *)((long)&reg_op3.u + 0x18),&local_c18,0x30);
      pMVar3 = func;
      MVar6 = gen_new_temp_reg((gen_ctx_t)ctx,MIR_T_I64,_mem_type);
      _MIR_new_var_op(&local_c48,(MIR_context_t)pMVar3,MVar6);
      memcpy((void *)((long)&res_reg_op_1.u + 0x18),&local_c48,0x30);
      pMVar3 = func;
      MIR_new_ref_op(&local_c78,(MIR_context_t)func,(MIR_item_t_conflict)ops_1[5].u._24_8_);
      new_insn = MIR_new_insn((MIR_context_t)pMVar3,MIR_MOV);
      gen_add_insn_before((gen_ctx_t)ctx,next_insn,new_insn);
      pMVar3 = func;
      if (local_30 == MIR_VA_ARG) {
        MIR_new_int_op(&local_ca8,(MIR_context_t)func,(ulong)(byte)op3._8_1_);
        pMVar9 = MIR_new_insn((MIR_context_t)pMVar3,MIR_MOV);
        memcpy(local_be8,(void *)((long)&res_reg_op_1.u + 0x18),0x30);
        gen_add_insn_before((gen_ctx_t)ctx,next_insn,pMVar9);
      }
      MIR_new_ref_op((MIR_op_t *)&n_xregs,(MIR_context_t)func,func_import_item_1);
      memcpy((void *)((long)&func_reg_op.u + 0x18),&n_xregs,0x30);
      memcpy((void *)((long)&ops_1[0].u + 0x18),(void *)((long)&reg_op3.u + 0x18),0x30);
      memcpy((void *)((long)&ops_1[1].u + 0x18),(void *)((long)&va_reg_op.u + 0x18),0x30);
      memcpy((void *)((long)&ops_1[2].u + 0x18),(void *)((long)&op3.u + 0x18),0x30);
      memcpy((void *)((long)&ops_1[3].u + 0x18),local_be8,0x30);
      if (local_30 == MIR_VA_BLOCK_ARG) {
        memcpy((void *)((long)&ops_1[4].u + 0x18),&next_insn[2].insn_link.next,0x30);
      }
      iVar5 = 6;
      if (local_30 == MIR_VA_ARG) {
        iVar5 = 5;
      }
      pMVar9 = MIR_new_insn_arr((MIR_context_t)func,MIR_CALL,(long)iVar5,
                                (MIR_op_t *)((long)&func_reg_op.u + 0x18));
      gen_add_insn_before((gen_ctx_t)ctx,next_insn,pMVar9);
      gen_delete_insn((gen_ctx_t)ctx,next_insn);
      break;
    case MIR_VA_START:
      MVar6 = gen_new_temp_reg((gen_ctx_t)ctx,MIR_T_I64,*(MIR_func_t *)(ctx->error_func + 0x40));
      _MIR_new_var_op((MIR_op_t *)((long)&va_op.u + 0x18),(MIR_context_t)pMVar3,MVar6);
      memcpy(&gp_offset,next_insn->ops,0x30);
      mem_offset = 0;
      var.size._4_4_ = 0x30;
      var.size._0_4_ = 0;
      if ((_mem_type->vararg_p == '\0') || (((ushort)va_op.data & 0xff) != 2)) {
        __assert_fail("func->vararg_p && va_op.mode == MIR_OP_VAR",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                      ,0x361,"void target_machinize(gen_ctx_t)");
      }
      for (local_7c4 = 0; pMVar4 = ctx, base = va_op._8_4_, local_7c4 < _mem_type->nargs;
          local_7c4 = local_7c4 + 1) {
        VARR_MIR_var_tget(&local_7e0,_mem_type->vars,(ulong)local_7c4);
        auStack_7c0 = (undefined1  [4])local_7e0.type;
        narg = local_7e0._4_4_;
        uVar1 = _auStack_7c0;
        var._0_8_ = local_7e0.name;
        var.name = (char *)local_7e0.size;
        auStack_7c0 = local_7e0.type;
        t = auStack_7c0;
        _auStack_7c0 = uVar1;
        if ((auStack_7c0 == (undefined1  [4])0x8) || (auStack_7c0 == (undefined1  [4])0x9)) {
          var.size._4_4_ = var.size._4_4_ + 0x10;
          if (0xaf < mem_offset) {
            var.size._0_4_ = (int)var.size + 8;
          }
        }
        else if (auStack_7c0 == (undefined1  [4])0xa) {
          var.size._0_4_ = (int)var.size + 0x10;
        }
        else {
          iVar5 = MIR_blk_type_p((MIR_type_t)t);
          if (iVar5 == 0) {
            mem_offset = mem_offset + 8;
            if (0x2f < mem_offset) {
              var.size._0_4_ = (int)var.size + 8;
            }
          }
          else {
            var.size._0_4_ = (int)var.size + (int)var.name;
          }
        }
      }
      _MIR_new_var_mem_op(&local_818,(MIR_context_t)func,MIR_T_U32,0,va_op._8_4_,0xffffffff,'\x01');
      MIR_new_int_op(&local_848,(MIR_context_t)func,(long)mem_offset);
      dst_op._8_8_ = local_818._8_8_;
      dst_op.data = local_818.data;
      dst_op.u.i = local_818.u.i;
      dst_op.u.str.s = local_818.u.str.s;
      dst_op.u._16_8_ = local_818.u._16_8_;
      dst_op.u.mem.disp = local_818.u.mem.disp;
      src_op._8_8_ = local_848._8_8_;
      src_op.data = local_848.data;
      src_op.u.i = local_848.u.i;
      src_op.u.str.s = local_848.u.str.s;
      src_op.u._16_8_ = local_848.u._16_8_;
      src_op.u.mem.disp = local_848.u.mem.disp;
      gen_mov((gen_ctx_t)pMVar4,next_insn,MIR_MOV,dst_op,src_op);
      new_insn = DLIST_MIR_insn_t_prev(next_insn);
      pMVar4 = ctx;
      _MIR_new_var_mem_op(&local_878,(MIR_context_t)func,MIR_T_U32,4,base,0xffffffff,'\x01');
      MIR_new_int_op(&local_8a8,(MIR_context_t)func,(long)var.size._4_4_);
      dst_op_00._8_8_ = local_878._8_8_;
      dst_op_00.data = local_878.data;
      dst_op_00.u.i = local_878.u.i;
      dst_op_00.u.str.s = local_878.u.str.s;
      dst_op_00.u._16_8_ = local_878.u._16_8_;
      dst_op_00.u.mem.disp = local_878.u.mem.disp;
      src_op_00._8_8_ = local_8a8._8_8_;
      src_op_00.data = local_8a8.data;
      src_op_00.u.i = local_8a8.u.i;
      src_op_00.u.str.s = local_8a8.u.str.s;
      src_op_00.u._16_8_ = local_8a8.u._16_8_;
      src_op_00.u.mem.disp = local_8a8.u.mem.disp;
      gen_mov((gen_ctx_t)pMVar4,next_insn,MIR_MOV,dst_op_00,src_op_00);
      pMVar3 = func;
      _MIR_new_var_op(&local_8d8,(MIR_context_t)func,5);
      MIR_new_int_op(&local_908,(MIR_context_t)func,
                     (long)((int)var.size + 8 + *(int *)((long)&(ctx[1].insn_nops)->els_num + 4)));
      pMVar9 = MIR_new_insn((MIR_context_t)pMVar3,MIR_ADD);
      gen_add_insn_before((gen_ctx_t)ctx,next_insn,pMVar9);
      pMVar4 = ctx;
      _MIR_new_var_mem_op(&local_938,(MIR_context_t)func,MIR_T_I64,8,base,0xffffffff,'\x01');
      dst_op_01._8_8_ = local_938._8_8_;
      dst_op_01.data = local_938.data;
      dst_op_01.u.i = local_938.u.i;
      dst_op_01.u.str.s = local_938.u.str.s;
      dst_op_01.u._16_8_ = local_938.u._16_8_;
      dst_op_01.u.mem.disp = local_938.u.mem.disp;
      src_op_01._8_8_ = treg_op.data;
      src_op_01.data = (void *)va_op.u.mem.disp;
      src_op_01.u.i = treg_op._8_8_;
      src_op_01.u._8_8_ = treg_op.u.i;
      src_op_01.u._16_8_ = treg_op.u.str.s;
      src_op_01.u.mem.disp = treg_op.u._16_8_;
      gen_mov((gen_ctx_t)pMVar4,next_insn,MIR_MOV,dst_op_01,src_op_01);
      pMVar3 = func;
      _MIR_new_var_op(&local_968,(MIR_context_t)func,5);
      MIR_new_int_op(&local_998,(MIR_context_t)func,-0xb0);
      pMVar9 = MIR_new_insn((MIR_context_t)pMVar3,MIR_ADD);
      gen_add_insn_before((gen_ctx_t)ctx,next_insn,pMVar9);
      pMVar4 = ctx;
      _MIR_new_var_mem_op((MIR_op_t *)&proto_item_1,(MIR_context_t)func,MIR_T_I64,0x10,base,
                          0xffffffff,'\x01');
      dst_op_02._8_8_ = uStack_9c0;
      dst_op_02.data = proto_item_1;
      dst_op_02.u.i = aStack_9b8.i;
      dst_op_02.u.str.s = aStack_9b8.str.s;
      dst_op_02.u._16_8_ = aStack_9b8._16_8_;
      dst_op_02.u.mem.disp = aStack_9b8.mem.disp;
      src_op_02._8_8_ = treg_op.data;
      src_op_02.data = (void *)va_op.u.mem.disp;
      src_op_02.u.i = treg_op._8_8_;
      src_op_02.u._8_8_ = treg_op.u.i;
      src_op_02.u._16_8_ = treg_op.u.str.s;
      src_op_02.u.mem.disp = treg_op.u._16_8_;
      gen_mov((gen_ctx_t)pMVar4,next_insn,MIR_MOV,dst_op_02,src_op_02);
      gen_delete_insn((gen_ctx_t)ctx,next_insn);
      break;
    case MIR_VA_END:
      gen_delete_insn((gen_ctx_t)ctx,next_insn);
    }
    next_insn = new_insn;
  } while( true );
}

Assistant:

static void target_machinize (gen_ctx_t gen_ctx) {
  MIR_context_t ctx = gen_ctx->ctx;
  MIR_func_t func;
  MIR_type_t type, mem_type, res_type;
  MIR_insn_code_t code, new_insn_code;
  MIR_insn_t insn, next_insn, new_insn;
  MIR_reg_t ret_reg, arg_reg;
  MIR_op_t ret_reg_op, arg_reg_op, mem_op, temp_op;
  size_t i, blk_size, int_arg_num = 0, fp_arg_num = 0, mem_size = spill_space_size;

  assert (curr_func_item->item_type == MIR_func_item);
  func = curr_func_item->u.func;
  block_arg_func_p = FALSE;
  start_sp_from_bp_offset = 8;
  keep_fp_p = func->vararg_p;
  for (i = 0; i < func->nargs; i++) {
    /* Argument extensions is already done in simplify */
    /* Prologue: generate arg_var = hard_reg|stack mem|stack addr ... */
    type = VARR_GET (MIR_var_t, func->vars, i).type;
    blk_size = MIR_blk_type_p (type) ? (VARR_GET (MIR_var_t, func->vars, i).size + 7) / 8 * 8 : 0;
#ifndef _WIN32
    if ((type == MIR_T_BLK + 1 && get_int_arg_reg (int_arg_num) != MIR_NON_VAR
         && (blk_size <= 8 || get_int_arg_reg (int_arg_num + 1) != MIR_NON_VAR))
        || (type == MIR_T_BLK + 2 && get_fp_arg_reg (fp_arg_num) != MIR_NON_VAR
            && (blk_size <= 8 || get_fp_arg_reg (fp_arg_num + 1) != MIR_NON_VAR))) {
      /* all is passed in gprs or fprs */
      MIR_type_t mov_type = type == MIR_T_BLK + 1 ? MIR_T_I64 : MIR_T_D;
      MIR_insn_code_t mov_code1, mov_code2;
      MIR_reg_t reg2, reg1 = get_arg_reg (mov_type, &int_arg_num, &fp_arg_num, &mov_code1);

      assert (blk_size <= 16);
      if (blk_size > 8) {
        reg2 = get_arg_reg (mov_type, &int_arg_num, &fp_arg_num, &mov_code2);
        new_insn = MIR_new_insn (ctx, mov_code1,
                                 _MIR_new_var_mem_op (ctx, mov_type, 8, i + MAX_HARD_REG + 1,
                                                      MIR_NON_VAR, 1),
                                 _MIR_new_var_op (ctx, reg2));
        prepend_insn (gen_ctx, new_insn);
      }
      new_insn = MIR_new_insn (ctx, mov_code1,
                               _MIR_new_var_mem_op (ctx, mov_type, 0, i + MAX_HARD_REG + 1,
                                                    MIR_NON_VAR, 1),
                               _MIR_new_var_op (ctx, reg1));
      prepend_insn (gen_ctx, new_insn);
      new_insn = MIR_new_insn (ctx, MIR_ALLOCA, _MIR_new_var_op (ctx, i + MAX_HARD_REG + 1),
                               MIR_new_int_op (ctx, blk_size));
      prepend_insn (gen_ctx, new_insn);
      continue;
    } else if ((type == MIR_T_BLK + 3 || type == MIR_T_BLK + 4)
               && get_int_arg_reg (int_arg_num) != MIR_NON_VAR
               && get_fp_arg_reg (fp_arg_num) != MIR_NON_VAR) {
      /* gpr and then fpr or fpr and then gpr */
      MIR_type_t mov_type1 = type == MIR_T_BLK + 3 ? MIR_T_I64 : MIR_T_D;
      MIR_type_t mov_type2 = type == MIR_T_BLK + 3 ? MIR_T_D : MIR_T_I64;
      MIR_insn_code_t mov_code1, mov_code2;
      MIR_reg_t reg1 = get_arg_reg (mov_type1, &int_arg_num, &fp_arg_num, &mov_code1);
      MIR_reg_t reg2 = get_arg_reg (mov_type2, &int_arg_num, &fp_arg_num, &mov_code2);

      assert (blk_size > 8 && blk_size <= 16);
      new_insn = MIR_new_insn (ctx, mov_code2,
                               _MIR_new_var_mem_op (ctx, mov_type2, 8, i + MAX_HARD_REG + 1,
                                                    MIR_NON_VAR, 1),
                               _MIR_new_var_op (ctx, reg2));
      prepend_insn (gen_ctx, new_insn);
      new_insn = MIR_new_insn (ctx, mov_code1,
                               _MIR_new_var_mem_op (ctx, mov_type1, 0, i + MAX_HARD_REG + 1,
                                                    MIR_NON_VAR, 1),
                               _MIR_new_var_op (ctx, reg1));
      prepend_insn (gen_ctx, new_insn);
      new_insn = MIR_new_insn (ctx, MIR_ALLOCA, _MIR_new_var_op (ctx, i + MAX_HARD_REG + 1),
                               MIR_new_int_op (ctx, blk_size));
      prepend_insn (gen_ctx, new_insn);
      continue;
    }
#endif
    int blk_p = MIR_blk_type_p (type);
#ifdef _WIN32
    if (blk_p && blk_size > 8) { /* just address */
      blk_p = FALSE;
      type = MIR_T_I64;
    }
#endif
    if (blk_p) {
      keep_fp_p = block_arg_func_p = TRUE;
#ifdef _WIN32
      assert (blk_size <= 8);
      if ((arg_reg = get_arg_reg (MIR_T_I64, &int_arg_num, &fp_arg_num, &new_insn_code))
          == MIR_NON_VAR) {
        new_insn
          = MIR_new_insn (ctx, MIR_ADD, _MIR_new_var_op (ctx, (MIR_reg_t) (i + MAX_HARD_REG + 1)),
                          _MIR_new_var_op (ctx, FP_HARD_REG),
                          MIR_new_int_op (ctx, mem_size + 8 /* ret */
                                                 + start_sp_from_bp_offset));
        mem_size += 8;
      } else { /* put reg into spill space and use its address: prepend in reverse order:  */
        int disp = (int) (mem_size + 8 /* ret */ + start_sp_from_bp_offset - spill_space_size
                          + 8 * get_int_arg_reg_num (arg_reg));
        new_insn
          = MIR_new_insn (ctx, MIR_ADD, _MIR_new_var_op (ctx, (MIR_reg_t) (i + MAX_HARD_REG + 1)),
                          _MIR_new_var_op (ctx, FP_HARD_REG), MIR_new_int_op (ctx, disp));
        prepend_insn (gen_ctx, new_insn);
        arg_reg_op = _MIR_new_var_op (ctx, arg_reg);
        mem_op = _MIR_new_var_mem_op (ctx, MIR_T_I64, disp, FP_HARD_REG, MIR_NON_VAR, 1);
        new_insn = MIR_new_insn (ctx, MIR_MOV, mem_op, arg_reg_op);
      }
#else
      new_insn = MIR_new_insn (ctx, MIR_ADD, _MIR_new_var_op (ctx, i + MAX_HARD_REG + 1),
                               _MIR_new_var_op (ctx, FP_HARD_REG),
                               MIR_new_int_op (ctx, mem_size + 8 /* ret addr */
                                                      + start_sp_from_bp_offset));
      mem_size += blk_size;
#endif
      prepend_insn (gen_ctx, new_insn);
    } else if ((arg_reg = get_arg_reg (type, &int_arg_num, &fp_arg_num, &new_insn_code))
               != MIR_NON_VAR) {
      arg_reg_op = _MIR_new_var_op (ctx, arg_reg);
      new_insn
        = MIR_new_insn (ctx, new_insn_code,
                        _MIR_new_var_op (ctx, (MIR_reg_t) (i + MAX_HARD_REG + 1)), arg_reg_op);
      prepend_insn (gen_ctx, new_insn);
    } else {
      /* arg is on the stack */
      keep_fp_p = block_arg_func_p = TRUE;
      mem_type = type == MIR_T_F || type == MIR_T_D || type == MIR_T_LD ? type : MIR_T_I64;
      new_insn_code = (type == MIR_T_F    ? MIR_FMOV
                       : type == MIR_T_D  ? MIR_DMOV
                       : type == MIR_T_LD ? MIR_LDMOV
                                          : MIR_MOV);
      mem_op = _MIR_new_var_mem_op (ctx, mem_type,
                                    mem_size + 8 /* ret */
                                      + start_sp_from_bp_offset,
                                    FP_HARD_REG, MIR_NON_VAR, 1);
      new_insn = MIR_new_insn (ctx, new_insn_code,
                               _MIR_new_var_op (ctx, (MIR_reg_t) (i + MAX_HARD_REG + 1)), mem_op);
      prepend_insn (gen_ctx, new_insn);
      mem_size += type == MIR_T_LD ? 16 : 8;
    }
  }
  alloca_p = FALSE;
  leaf_p = TRUE;
  for (insn = DLIST_HEAD (MIR_insn_t, func->insns); insn != NULL; insn = next_insn) {
    next_insn = DLIST_NEXT (MIR_insn_t, insn);
    code = insn->code;
    switch (code) {
    case MIR_UI2F:
    case MIR_UI2D:
    case MIR_UI2LD:
    case MIR_LD2I: {
      /* Use a builtin func call: mov freg, func ref; call proto, freg, res_reg, op_reg */
      MIR_item_t proto_item, func_import_item;
      MIR_op_t freg_op, res_reg_op = insn->ops[0], op_reg_op = insn->ops[1], ops[4];

      get_builtin (gen_ctx, code, &proto_item, &func_import_item);
      assert (res_reg_op.mode == MIR_OP_VAR && op_reg_op.mode == MIR_OP_VAR);
      freg_op
        = _MIR_new_var_op (ctx, gen_new_temp_reg (gen_ctx, MIR_T_I64, curr_func_item->u.func));
      next_insn = new_insn
        = MIR_new_insn (ctx, MIR_MOV, freg_op, MIR_new_ref_op (ctx, func_import_item));
      gen_add_insn_before (gen_ctx, insn, new_insn);
      ops[0] = MIR_new_ref_op (ctx, proto_item);
      ops[1] = freg_op;
      ops[2] = res_reg_op;
      ops[3] = op_reg_op;
      new_insn = MIR_new_insn_arr (ctx, MIR_CALL, 4, ops);
      gen_add_insn_before (gen_ctx, insn, new_insn);
      gen_delete_insn (gen_ctx, insn);
      break;
    }
    case MIR_VA_START: {
      MIR_op_t treg_op
        = _MIR_new_var_op (ctx, gen_new_temp_reg (gen_ctx, MIR_T_I64, curr_func_item->u.func));
      MIR_op_t va_op = insn->ops[0];
      MIR_reg_t va_reg;
#ifndef _WIN32
      int gp_offset = 0, fp_offset = 48, mem_offset = 0;
      MIR_var_t var;

      assert (func->vararg_p && va_op.mode == MIR_OP_VAR);
      for (uint32_t narg = 0; narg < func->nargs; narg++) {
        var = VARR_GET (MIR_var_t, func->vars, narg);
        if (var.type == MIR_T_F || var.type == MIR_T_D) {
          fp_offset += 16;
          if (gp_offset >= 176) mem_offset += 8;
        } else if (var.type == MIR_T_LD) {
          mem_offset += 16;
        } else if (MIR_blk_type_p (var.type)) {
          mem_offset += var.size;
        } else { /* including RBLK */
          gp_offset += 8;
          if (gp_offset >= 48) mem_offset += 8;
        }
      }
      va_reg = va_op.u.var;
      /* Insns can be not simplified as soon as they match a machine insn.  */
      /* mem32[va_reg] = gp_offset; mem32[va_reg] = fp_offset */
      gen_mov (gen_ctx, insn, MIR_MOV,
               _MIR_new_var_mem_op (ctx, MIR_T_U32, 0, va_reg, MIR_NON_VAR, 1),
               MIR_new_int_op (ctx, gp_offset));
      next_insn = DLIST_PREV (MIR_insn_t, insn);
      gen_mov (gen_ctx, insn, MIR_MOV,
               _MIR_new_var_mem_op (ctx, MIR_T_U32, 4, va_reg, MIR_NON_VAR, 1),
               MIR_new_int_op (ctx, fp_offset));
      /* overflow_arg_area_reg: treg = start sp + 8 + mem_offset; mem64[va_reg + 8] = treg */
      new_insn
        = MIR_new_insn (ctx, MIR_ADD, treg_op, _MIR_new_var_op (ctx, FP_HARD_REG),
                        MIR_new_int_op (ctx, 8 /*ret*/ + mem_offset + start_sp_from_bp_offset));
      gen_add_insn_before (gen_ctx, insn, new_insn);
      gen_mov (gen_ctx, insn, MIR_MOV,
               _MIR_new_var_mem_op (ctx, MIR_T_I64, 8, va_reg, MIR_NON_VAR, 1), treg_op);
      /* reg_save_area: treg = start sp - reg_save_area_size; mem64[va_reg + 16] = treg */
      new_insn = MIR_new_insn (ctx, MIR_ADD, treg_op, _MIR_new_var_op (ctx, FP_HARD_REG),
                               MIR_new_int_op (ctx, -reg_save_area_size));
      gen_add_insn_before (gen_ctx, insn, new_insn);
      gen_mov (gen_ctx, insn, MIR_MOV,
               _MIR_new_var_mem_op (ctx, MIR_T_I64, 16, va_reg, MIR_NON_VAR, 1), treg_op);
#else
      /* init va_list */
      mem_size = 8 /*ret*/ + start_sp_from_bp_offset + func->nargs * 8;
      new_insn = MIR_new_insn (ctx, MIR_ADD, treg_op, _MIR_new_var_op (ctx, FP_HARD_REG),
                               MIR_new_int_op (ctx, mem_size));
      gen_add_insn_before (gen_ctx, insn, new_insn);
      va_reg = va_op.u.var;
      gen_mov (gen_ctx, insn, MIR_MOV,
               _MIR_new_var_mem_op (ctx, MIR_T_I64, 0, va_reg, MIR_NON_VAR, 1), treg_op);
#endif
      gen_delete_insn (gen_ctx, insn);
      break;
    }
    case MIR_VA_END: /* do nothing */ gen_delete_insn (gen_ctx, insn); break;
    case MIR_VA_ARG:
    case MIR_VA_BLOCK_ARG: {
      /* Use a builtin func call:
         mov func_reg, func ref; [mov reg3, type;] call proto, func_reg, res_reg, va_reg,
         reg3 */
      MIR_item_t proto_item, func_import_item;
      MIR_op_t ops[6], func_reg_op, reg_op3;
      MIR_op_t res_reg_op = insn->ops[0], va_reg_op = insn->ops[1], op3 = insn->ops[2];

      get_builtin (gen_ctx, code, &proto_item, &func_import_item);
      assert (res_reg_op.mode == MIR_OP_VAR && va_reg_op.mode == MIR_OP_VAR
              && op3.mode == (code == MIR_VA_ARG ? MIR_OP_VAR_MEM : MIR_OP_VAR));
      func_reg_op = _MIR_new_var_op (ctx, gen_new_temp_reg (gen_ctx, MIR_T_I64, func));
      reg_op3 = _MIR_new_var_op (ctx, gen_new_temp_reg (gen_ctx, MIR_T_I64, func));
      next_insn = new_insn
        = MIR_new_insn (ctx, MIR_MOV, func_reg_op, MIR_new_ref_op (ctx, func_import_item));
      gen_add_insn_before (gen_ctx, insn, new_insn);
      if (code == MIR_VA_ARG) {
        new_insn = MIR_new_insn (ctx, MIR_MOV, reg_op3,
                                 MIR_new_int_op (ctx, (int64_t) op3.u.var_mem.type));
        op3 = reg_op3;
        gen_add_insn_before (gen_ctx, insn, new_insn);
      }
      ops[0] = MIR_new_ref_op (ctx, proto_item);
      ops[1] = func_reg_op;
      ops[2] = res_reg_op;
      ops[3] = va_reg_op;
      ops[4] = op3;
      if (code == MIR_VA_BLOCK_ARG) ops[5] = insn->ops[3];
      new_insn = MIR_new_insn_arr (ctx, MIR_CALL, code == MIR_VA_ARG ? 5 : 6, ops);
      gen_add_insn_before (gen_ctx, insn, new_insn);
      gen_delete_insn (gen_ctx, insn);
      break;
    }
    case MIR_ALLOCA: keep_fp_p = alloca_p = TRUE; break;
    case MIR_RET: {
      /* In simplify we already transformed code for one return insn
         and added extension in return (if any).  */
      uint32_t n_iregs = 0, n_xregs = 0, n_fregs = 0;

#ifdef _WIN32
      if (curr_func_item->u.func->nres > 1)
        (*MIR_get_error_func (ctx)) (MIR_ret_error,
                                     "Windows x86-64 doesn't support multiple return values");
#endif
      assert (curr_func_item->u.func->nres == MIR_insn_nops (ctx, insn));
      for (size_t nres = 0; nres < curr_func_item->u.func->nres; nres++) {
        res_type = curr_func_item->u.func->res_types[nres];
        if ((res_type == MIR_T_F || res_type == MIR_T_D) && n_xregs < 2) {
          new_insn_code = res_type == MIR_T_F ? MIR_FMOV : MIR_DMOV;
          ret_reg = n_xregs++ == 0 ? XMM0_HARD_REG : XMM1_HARD_REG;
        } else if (res_type == MIR_T_LD && n_fregs < 2) {  // ???
          new_insn_code = MIR_LDMOV;
          ret_reg = n_fregs == 0 ? ST0_HARD_REG : ST1_HARD_REG;
          n_fregs++;
        } else if (n_iregs < 2) {
          new_insn_code = MIR_MOV;
          ret_reg = n_iregs++ == 0 ? AX_HARD_REG : DX_HARD_REG;
        } else {
          (*MIR_get_error_func (ctx)) (MIR_ret_error,
                                       "x86-64 can not handle this combination of return values");
        }
        ret_reg_op = _MIR_new_var_op (ctx, ret_reg);
        new_insn = MIR_new_insn (ctx, new_insn_code, ret_reg_op, insn->ops[nres]);
        gen_add_insn_before (gen_ctx, insn, new_insn);
        insn->ops[nres] = ret_reg_op;
      }
      break;
    }
    case MIR_LSH:
    case MIR_RSH:
    case MIR_URSH:
    case MIR_LSHS:
    case MIR_RSHS:
    case MIR_URSHS: {
      /* We can access only cl as shift register: */
      MIR_op_t creg_op = _MIR_new_var_op (ctx, CX_HARD_REG);

      new_insn = MIR_new_insn (ctx, MIR_MOV, creg_op, insn->ops[2]);
      gen_add_insn_before (gen_ctx, insn, new_insn);
      insn->ops[2] = creg_op;
      break;
    }
    case MIR_UMULO:
    case MIR_UMULOS: {
      /* We can use only ax as zero and the 1st operand: */
      MIR_op_t areg_op = _MIR_new_var_op (ctx, AX_HARD_REG);

      new_insn = MIR_new_insn (ctx, MIR_MOV, areg_op, insn->ops[1]);
      gen_add_insn_before (gen_ctx, insn, new_insn);
      new_insn = MIR_new_insn (ctx, MIR_MOV, insn->ops[0], areg_op);
      gen_add_insn_after (gen_ctx, insn, new_insn);
      insn->ops[0] = insn->ops[1] = areg_op;
      break;
    }
    case MIR_DIV:
    case MIR_UDIV:
    case MIR_DIVS:
    case MIR_UDIVS: {
      /* Divide uses ax/dx as operands: */
      MIR_op_t areg_op = _MIR_new_var_op (ctx, AX_HARD_REG);

      new_insn = MIR_new_insn (ctx, MIR_MOV, areg_op, insn->ops[1]);
      gen_add_insn_before (gen_ctx, insn, new_insn);
      new_insn = MIR_new_insn (ctx, MIR_MOV, insn->ops[0], areg_op);
      gen_add_insn_after (gen_ctx, insn, new_insn);
      insn->ops[0] = insn->ops[1] = areg_op;
      break;
    }
    case MIR_MOD:
    case MIR_UMOD:
    case MIR_MODS:
    case MIR_UMODS: {
      /* Divide uses ax/dx as operands: */
      MIR_op_t areg_op = _MIR_new_var_op (ctx, AX_HARD_REG);
      MIR_op_t dreg_op = _MIR_new_var_op (ctx, DX_HARD_REG);

      new_insn = MIR_new_insn (ctx, MIR_MOV, areg_op, insn->ops[1]);
      gen_add_insn_before (gen_ctx, insn, new_insn);
      insn->ops[1] = areg_op;
      new_insn = MIR_new_insn (ctx, MIR_MOV, insn->ops[0], dreg_op);
      gen_add_insn_after (gen_ctx, insn, new_insn);
      insn->ops[0] = dreg_op;
      break;
    }
    case MIR_EQ:
    case MIR_NE:
    case MIR_LT:
    case MIR_ULT:
    case MIR_LE:
    case MIR_ULE:
    case MIR_GT:
    case MIR_UGT:
    case MIR_GE:
    case MIR_UGE:
    case MIR_EQS:
    case MIR_NES:
    case MIR_LTS:
    case MIR_ULTS:
    case MIR_LES:
    case MIR_ULES:
    case MIR_GTS:
    case MIR_UGTS:
    case MIR_GES:
    case MIR_UGES:
    case MIR_FEQ:
    case MIR_FNE:
    case MIR_FLT:
    case MIR_FLE:
    case MIR_FGT:
    case MIR_FGE:
    case MIR_DEQ:
    case MIR_DNE:
    case MIR_DLT:
    case MIR_DLE:
    case MIR_DGT:
    case MIR_DGE: {
      new_insn = MIR_new_insn (ctx, MIR_UEXT8, insn->ops[0], insn->ops[0]);
      gen_add_insn_after (gen_ctx, insn, new_insn);
      /* Following conditional branches are changed to correctly process unordered numbers: */
      switch (code) {
      case MIR_FLT:
        SWAP (insn->ops[1], insn->ops[2], temp_op);
        insn->code = MIR_FGT;
        break;
      case MIR_FLE:
        SWAP (insn->ops[1], insn->ops[2], temp_op);
        insn->code = MIR_FGE;
        break;
      case MIR_DLT:
        SWAP (insn->ops[1], insn->ops[2], temp_op);
        insn->code = MIR_DGT;
        break;
      case MIR_DLE:
        SWAP (insn->ops[1], insn->ops[2], temp_op);
        insn->code = MIR_DGE;
        break;
      default: break; /* do nothing */
      }
      break;
    }
    /* Following conditional branches are changed to correctly process unordered numbers: */
    case MIR_LDLT:
      SWAP (insn->ops[1], insn->ops[2], temp_op);
      insn->code = MIR_LDGT;
      break;
    case MIR_LDLE:
      SWAP (insn->ops[1], insn->ops[2], temp_op);
      insn->code = MIR_LDGE;
      break;
    case MIR_FBLT:
      SWAP (insn->ops[1], insn->ops[2], temp_op);
      insn->code = MIR_FBGT;
      break;
    case MIR_FBLE:
      SWAP (insn->ops[1], insn->ops[2], temp_op);
      insn->code = MIR_FBGE;
      break;
    case MIR_DBLT:
      SWAP (insn->ops[1], insn->ops[2], temp_op);
      insn->code = MIR_DBGT;
      break;
    case MIR_DBLE:
      SWAP (insn->ops[1], insn->ops[2], temp_op);
      insn->code = MIR_DBGE;
      break;
    case MIR_LDBLT:
      SWAP (insn->ops[1], insn->ops[2], temp_op);
      insn->code = MIR_LDBGT;
      break;
    case MIR_LDBLE:
      SWAP (insn->ops[1], insn->ops[2], temp_op);
      insn->code = MIR_LDBGE;
      break;
    default:
      if (MIR_call_code_p (code)) {
        machinize_call (gen_ctx, insn);
        leaf_p = FALSE;
      }
      break;
    }
  }
}